

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.h
# Opt level: O0

Dec_Graph_t * Dec_GraphCreateConst0(void)

{
  Dec_Graph_t *__s;
  Dec_Graph_t *pGraph;
  
  __s = (Dec_Graph_t *)malloc(0x20);
  memset(__s,0,0x20);
  __s->fConst = 1;
  __s->eRoot = (Dec_Edge_t)((uint)__s->eRoot & 0xfffffffe | 1);
  return __s;
}

Assistant:

static inline Dec_Graph_t * Dec_GraphCreateConst0()   
{
    Dec_Graph_t * pGraph;
    pGraph = ABC_ALLOC( Dec_Graph_t, 1 );
    memset( pGraph, 0, sizeof(Dec_Graph_t) );
    pGraph->fConst = 1;
    pGraph->eRoot.fCompl = 1;
    return pGraph;
}